

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# room-math.h
# Opt level: O2

Query * __thiscall RoomMath::generate(Query *__return_storage_ptr__,RoomMath *this)

{
  int iVar1;
  Query *query;
  pointer pQVar2;
  int i;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined8 local_88;
  undefined1 local_60 [64];
  
  local_88 = 0;
  fVar4 = 0.0;
  for (iVar3 = 0; iVar3 != 0x20; iVar3 = iVar3 + 1) {
    fVar5 = anon_unknown.dwarf_11b02::frand();
    fVar6 = anon_unknown.dwarf_11b02::frand();
    fVar11 = fVar5 * 1.5 + -0.75;
    fVar6 = fVar6 * 1.5 + -0.75;
    fVar5 = 1e+06;
    for (pQVar2 = (this->super_RoomBase).pool.super__Vector_base<Query,_std::allocator<Query>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pQVar2 != (this->super_RoomBase).pool.super__Vector_base<Query,_std::allocator<Query>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pQVar2 = pQVar2 + 1) {
      fVar9 = fVar11 - pQVar2->x;
      fVar10 = fVar6 - pQVar2->y;
      fVar9 = fVar9 * fVar9 + fVar10 * fVar10;
      if (fVar5 <= fVar9) {
        fVar9 = fVar5;
      }
      fVar5 = fVar9;
    }
    uVar7 = (int)((uint)(fVar4 < fVar5) << 0x1f) >> 0x1f;
    uVar8 = (int)((uint)(fVar4 < fVar5) << 0x1f) >> 0x1f;
    if (fVar5 <= fVar4) {
      fVar5 = fVar4;
    }
    local_88 = CONCAT44(~uVar8 & local_88._4_4_ | (uint)fVar6 & uVar8,
                        ~uVar7 & (uint)local_88 | (uint)fVar11 & uVar7);
    fVar4 = fVar5;
  }
  iVar3 = rand();
  iVar1 = rand();
  std::
  function<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(int,_int)>
  ::operator()((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_60,&this->getQuery,iVar3 % 100,iVar1 % 100);
  __return_storage_ptr__->x = (float)(uint)local_88;
  __return_storage_ptr__->y = (float)local_88._4_4_;
  __return_storage_ptr__->clientId = 0;
  __return_storage_ptr__->tGuessed_s = 0.0;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->text,(string *)local_60);
  std::__cxx11::string::string
            ((string *)&__return_storage_ptr__->answer,(string *)(local_60 + 0x20));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_60);
  return __return_storage_ptr__;
}

Assistant:

virtual Query generate() override {
        float dist = 0.0f;

        float x = 0.0f;
        float y = 0.0f;

        for (int i = 0; i < 32; ++i) {
            float cx = 1.50f*frand() - 0.75f;
            float cy = 1.50f*frand() - 0.75f;

            float curd = 1e6;
            for (auto & query : pool) {
                float dx = cx - query.x;
                float dy = cy - query.y;

                float d = dx*dx + dy*dy;
                if (d < curd) {
                    curd = d;
                }
            }

            if (curd > dist) {
                dist = curd;
                x = cx;
                y = cy;
            }
        }

        int a = rand()%100;
        int b = rand()%100;

        auto [ text, answer ] = getQuery(a, b);

        return { x, y, 0, 0.0f, text, answer };
    }